

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O3

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int _w_00;
  Mat local_80;
  int local_3c;
  Option *local_38;
  
  iVar5 = bottom_blob->dims;
  _w_00 = bottom_blob->w;
  _w = bottom_blob->h;
  _h = bottom_blob->c;
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_3c = _w_00;
            local_38 = opt;
            free(top_blob->data);
            opt = local_38;
            _w_00 = local_3c;
          }
        }
        else {
          local_3c = _w_00;
          local_38 = opt;
          (*top_blob->allocator->_vptr_Allocator[3])();
          opt = local_38;
          _w_00 = local_3c;
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->packing = bottom_blob->packing;
    top_blob->allocator = bottom_blob->allocator;
    iVar1 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar4 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar3;
    top_blob->c = iVar4;
    top_blob->cstep = bottom_blob->cstep;
  }
  iVar1 = this->squeeze_h;
  if ((_h == 1 && iVar5 == 3) && this->squeeze_c != 0) {
    if (_w == 1 && iVar1 != 0) {
      Mat::reshape(&local_80,bottom_blob,_w_00,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
    else {
      Mat::reshape(&local_80,bottom_blob,_w_00,_w,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
  }
  else if (_w == 1 && (1 < iVar5 && iVar1 != 0)) {
    if (_w_00 == 1 && this->squeeze_w != 0) {
      Mat::reshape(&local_80,bottom_blob,_h,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
    else {
      Mat::reshape(&local_80,bottom_blob,_w_00,_h,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
  }
  else {
    if (_w_00 != 1 || (iVar5 < 1 || this->squeeze_w == 0)) goto LAB_0014e73e;
    if (iVar1 == 0 || _w != 1) {
      Mat::reshape(&local_80,bottom_blob,_w,_h,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
    else {
      Mat::reshape(&local_80,bottom_blob,_h,opt->blob_allocator);
      if (&local_80 != top_blob) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_80.data;
        top_blob->refcount = local_80.refcount;
        top_blob->elemsize = local_80.elemsize;
        top_blob->packing = local_80.packing;
        top_blob->allocator = local_80.allocator;
        top_blob->dims = local_80.dims;
        top_blob->w = local_80.w;
        top_blob->h = local_80.h;
        top_blob->c = local_80.c;
        top_blob->cstep = local_80.cstep;
      }
      if (local_80.refcount == (int *)0x0) goto LAB_0014e73e;
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) goto LAB_0014e73e;
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        goto LAB_0014e73e;
      }
    }
  }
  if (local_80.data != (void *)0x0) {
    free(local_80.data);
  }
LAB_0014e73e:
  if ((top_blob->data == (void *)0x0) || (iVar5 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar5 = -100;
  }
  return iVar5;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}